

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_tests.cc
# Opt level: O2

void __thiscall PointTest_Initialization_Test::TestBody(PointTest_Initialization_Test *this)

{
  char *pcVar1;
  double dVar2;
  AssertHelper AStack_58;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_50;
  AssertionResult gtest_ar;
  point_t p3;
  point_t p2;
  point_t p1;
  
  point_init(&p1,3.0,0.0);
  point_init(&p2,0.0,4.0);
  point_new(&p3);
  dVar2 = point_x(&p1);
  testing::internal::CmpHelperFloatingPointEQ<float>
            ((internal *)&gtest_ar,"point_x(&p1)","3.0",(float)dVar2,3.0);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_50);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_58,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/gkthiruvathukal[P]systems-code-examples/simple_adt/point_tests.cc"
               ,0xf,pcVar1);
    testing::internal::AssertHelper::operator=(&AStack_58,(Message *)&local_50);
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar.message_);
    dVar2 = point_y(&p1);
    testing::internal::CmpHelperFloatingPointEQ<float>
              ((internal *)&gtest_ar,"point_y(&p1)","0.0",(float)dVar2,0.0);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_50);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl ==
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pcVar1 = "";
      }
      else {
        pcVar1 = *(char **)gtest_ar.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                (&AStack_58,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/gkthiruvathukal[P]systems-code-examples/simple_adt/point_tests.cc"
                 ,0x10,pcVar1);
      testing::internal::AssertHelper::operator=(&AStack_58,(Message *)&local_50);
    }
    else {
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar.message_);
      dVar2 = point_x(&p2);
      testing::internal::CmpHelperFloatingPointEQ<float>
                ((internal *)&gtest_ar,"point_x(&p2)","0.0",(float)dVar2,0.0);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&local_50);
        if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )gtest_ar.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl ==
            (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )0x0) {
          pcVar1 = "";
        }
        else {
          pcVar1 = *(char **)gtest_ar.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&AStack_58,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/gkthiruvathukal[P]systems-code-examples/simple_adt/point_tests.cc"
                   ,0x12,pcVar1);
        testing::internal::AssertHelper::operator=(&AStack_58,(Message *)&local_50);
      }
      else {
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar.message_);
        dVar2 = point_y(&p2);
        testing::internal::CmpHelperFloatingPointEQ<float>
                  ((internal *)&gtest_ar,"point_y(&p2)","4.0",(float)dVar2,4.0);
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&local_50);
          if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )gtest_ar.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl ==
              (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )0x0) {
            pcVar1 = "";
          }
          else {
            pcVar1 = *(char **)gtest_ar.message_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&AStack_58,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/gkthiruvathukal[P]systems-code-examples/simple_adt/point_tests.cc"
                     ,0x13,pcVar1);
          testing::internal::AssertHelper::operator=(&AStack_58,(Message *)&local_50);
        }
        else {
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(&gtest_ar.message_);
          dVar2 = point_x(&p3);
          testing::internal::CmpHelperFloatingPointEQ<float>
                    ((internal *)&gtest_ar,"point_x(&p3)","0.0",(float)dVar2,0.0);
          if (gtest_ar.success_ != false) {
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr(&gtest_ar.message_);
            dVar2 = point_y(&p3);
            testing::internal::CmpHelperFloatingPointEQ<float>
                      ((internal *)&gtest_ar,"point_y(&p3)","0.0",(float)dVar2,0.0);
            if (gtest_ar.success_ == false) {
              testing::Message::Message((Message *)&local_50);
              if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )gtest_ar.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl ==
                  (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )0x0) {
                pcVar1 = "";
              }
              else {
                pcVar1 = *(char **)gtest_ar.message_._M_t.
                                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   .
                                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                   ._M_head_impl;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&AStack_58,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/gkthiruvathukal[P]systems-code-examples/simple_adt/point_tests.cc"
                         ,0x16,pcVar1);
              testing::internal::AssertHelper::operator=(&AStack_58,(Message *)&local_50);
              testing::internal::AssertHelper::~AssertHelper(&AStack_58);
              if (local_50._M_head_impl !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                (**(code **)(*(long *)local_50._M_head_impl + 8))();
              }
            }
            goto LAB_00109598;
          }
          testing::Message::Message((Message *)&local_50);
          if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )gtest_ar.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl ==
              (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )0x0) {
            pcVar1 = "";
          }
          else {
            pcVar1 = *(char **)gtest_ar.message_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&AStack_58,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/gkthiruvathukal[P]systems-code-examples/simple_adt/point_tests.cc"
                     ,0x15,pcVar1);
          testing::internal::AssertHelper::operator=(&AStack_58,(Message *)&local_50);
        }
      }
    }
  }
  testing::internal::AssertHelper::~AssertHelper(&AStack_58);
  if (local_50._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_50._M_head_impl + 8))();
  }
LAB_00109598:
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST(PointTest, Initialization)
{
    point_t p1, p2, p3;

    point_init(&p1, 3, 0);
    point_init(&p2, 0, 4);
    point_new(&p3);

    ASSERT_FLOAT_EQ( point_x(&p1), 3.0);
    ASSERT_FLOAT_EQ( point_y(&p1), 0.0);

    ASSERT_FLOAT_EQ( point_x(&p2), 0.0);
    ASSERT_FLOAT_EQ( point_y(&p2), 4.0);

    ASSERT_FLOAT_EQ( point_x(&p3), 0.0);
    ASSERT_FLOAT_EQ( point_y(&p3), 0.0);

}